

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImGui::CalcTypematicPressedRepeatAmount
              (float t,float t_prev,float repeat_delay,float repeat_rate)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 1;
  if ((((t != 0.0) || (NAN(t))) && (iVar1 = 0, repeat_delay < t)) && (0.0 < repeat_rate)) {
    iVar2 = (int)((t - repeat_delay) / repeat_rate) - (int)((t_prev - repeat_delay) / repeat_rate);
    iVar1 = 0;
    if (0 < iVar2) {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int ImGui::CalcTypematicPressedRepeatAmount(float t, float t_prev, float repeat_delay, float repeat_rate)
{
    if (t == 0.0f)
        return 1;
    if (t <= repeat_delay || repeat_rate <= 0.0f)
        return 0;
    const int count = (int)((t - repeat_delay) / repeat_rate) - (int)((t_prev - repeat_delay) / repeat_rate);
    return (count > 0) ? count : 0;
}